

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbuildmultiphysicsmesh.cpp
# Opt level: O3

void TPZBuildMultiphysicsMesh::TransferFromMeshesT<std::complex<double>>
               (TPZVec<TPZCompMesh_*> *cmeshVec,TPZCompMesh *MFMesh)

{
  int iVar1;
  int iVar2;
  complex<double> *pcVar3;
  undefined8 uVar4;
  int iVar5;
  TPZFMatrix<std::complex<double>_> *pTVar6;
  TPZFMatrix<std::complex<double>_> *pTVar7;
  TPZConnect *pTVar8;
  int64_t iVar9;
  TPZSubCompMesh *this;
  long lVar10;
  long lVar11;
  int64_t iVar12;
  TPZCompEl **ppTVar13;
  TPZCompMesh *pTVar14;
  int iVar15;
  int64_t iVar16;
  long lVar17;
  int r;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> indexes;
  complex<double> getval;
  TPZVec<std::pair<TPZCompMesh_*,_long>_> local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_68._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019e0ed0;
  local_68.fStore = (pair<TPZCompMesh_*,_long> *)0x0;
  local_68.fNElements = 0;
  local_68.fNAlloc = 0;
  ComputeAtomicIndexes(MFMesh,&local_68);
  iVar12 = local_68.fNElements;
  pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&MFMesh->fSolution);
  if (0 < iVar12) {
    iVar16 = 0;
    do {
      pTVar14 = local_68.fStore[iVar16].first;
      if (pTVar14 != (TPZCompMesh *)0x0) {
        pTVar7 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar14->fSolution);
        pTVar8 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(pTVar14->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                            local_68.fStore[iVar16].second);
        lVar10 = pTVar8->fSequenceNumber;
        if (lVar10 < 0) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                     ,0x14e);
        }
        iVar5 = (pTVar14->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[(int)lVar10].dim;
        pTVar8 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(MFMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,iVar16);
        lVar11 = pTVar8->fSequenceNumber;
        if (lVar11 < 0) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                     ,0x152);
        }
        if (0 < iVar5) {
          iVar15 = 0;
          do {
            iVar9 = TPZBlock::Index(&pTVar14->fBlock,lVar10,iVar15);
            local_48 = *(undefined8 *)pTVar7->fElem[iVar9]._M_value;
            uStack_40 = *(undefined8 *)(pTVar7->fElem[iVar9]._M_value + 8);
            iVar9 = TPZBlock::Index(&MFMesh->fBlock,lVar11,iVar15);
            pcVar3 = pTVar6->fElem;
            *(undefined8 *)pcVar3[iVar9]._M_value = local_48;
            *(undefined8 *)(pcVar3[iVar9]._M_value + 8) = uStack_40;
            iVar15 = iVar15 + 1;
          } while (iVar5 != iVar15);
        }
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 != iVar12);
  }
  this = (TPZSubCompMesh *)__dynamic_cast(MFMesh,&TPZCompMesh::typeinfo,&TPZSubCompMesh::typeinfo,0)
  ;
  if (this != (TPZSubCompMesh *)0x0) {
    lVar10 = (**(code **)(*(long *)&this->super_TPZCompMesh + 0x98))();
    pTVar6 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_((TPZSolutionMatrix *)(lVar10 + 0x370));
    iVar5 = (**(code **)(*(long *)&this->super_TPZCompEl + 0x90))();
    if (0 < iVar5) {
      iVar15 = 0;
      do {
        lVar11 = (**(code **)(*(long *)&this->super_TPZCompEl + 0xa0))
                           (&this->super_TPZCompEl,iVar15);
        iVar12 = TPZSubCompMesh::InternalIndex(this,lVar11);
        if (lVar11 == -1) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                     ,0x169);
        }
        TPZSolutionMatrix::operator_cast_to_TPZFMatrix_((TPZSolutionMatrix *)(lVar10 + 0x370));
        pTVar8 = TPZChunkVector<TPZConnect,_10>::operator[]
                           ((TPZChunkVector<TPZConnect,_10> *)(lVar10 + 0x158),lVar11);
        lVar11 = pTVar8->fSequenceNumber;
        lVar17 = (long)(int)lVar11 * 0x10;
        iVar1 = *(int *)(*(long *)(lVar10 + 0x5f0) + 0xc + lVar17);
        pTVar7 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                           (&(this->super_TPZCompMesh).fSolution);
        pTVar8 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(this->super_TPZCompMesh).fConnectVec.
                             super_TPZChunkVector<TPZConnect,_10>,iVar12);
        iVar12 = pTVar8->fSequenceNumber;
        if (lVar11 < 0) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/pzbuildmultiphysicsmesh.cpp"
                     ,0x177);
        }
        if (0 < iVar1) {
          r = 0;
          do {
            iVar2 = *(int *)(*(long *)(lVar10 + 0x5f0) + 8 + lVar17);
            iVar16 = TPZBlock::Index(&(this->super_TPZCompMesh).fBlock,iVar12,r);
            pcVar3 = pTVar6->fElem;
            uVar4 = *(undefined8 *)(pTVar7->fElem[iVar16]._M_value + 8);
            *(undefined8 *)pcVar3[iVar2 + r]._M_value =
                 *(undefined8 *)pTVar7->fElem[iVar16]._M_value;
            *(undefined8 *)(pcVar3[iVar2 + r]._M_value + 8) = uVar4;
            r = r + 1;
          } while (iVar1 != r);
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 != iVar5);
    }
  }
  lVar10 = (MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar10) {
    lVar11 = 0;
    do {
      ppTVar13 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                           (&(MFMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,lVar11);
      if (*ppTVar13 != (TPZCompEl *)0x0) {
        pTVar14 = (TPZCompMesh *)
                  __dynamic_cast(*ppTVar13,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
        if (pTVar14 != (TPZCompMesh *)0x0) {
          TransferFromMeshes(cmeshVec,pTVar14);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
  }
  local_68._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019e0ed0;
  if (local_68.fStore != (pair<TPZCompMesh_*,_long> *)0x0) {
    operator_delete__(local_68.fStore);
  }
  return;
}

Assistant:

void TPZBuildMultiphysicsMesh::TransferFromMeshesT(TPZVec<TPZCompMesh *> &cmeshVec,
                                                   TPZCompMesh *MFMesh)
{
    
    TPZVec<atomic_index> indexes;
    ComputeAtomicIndexes(MFMesh, indexes);
    int64_t nconnect = indexes.size();
    TPZBlock &blockMF = MFMesh->Block();
    TPZFMatrix<TVar> &solMF = MFMesh->Solution();
    for(int64_t connect = 0; connect < nconnect; connect++)
    {
        TPZCompMesh *atomic_mesh = indexes[connect].first;
        if(!atomic_mesh) continue;
		TPZBlock &block = atomic_mesh->Block();
        TPZFMatrix<TVar> &sol = atomic_mesh->Solution();
        TPZConnect &con = atomic_mesh->ConnectVec()[indexes[connect].second];
        int64_t seqnum = con.SequenceNumber();
        if(seqnum<0) DebugStop();       /// Whether connect was deleted by previous refined process
        int blsize = block.Size(seqnum);
        TPZConnect &conMF = MFMesh->ConnectVec()[connect];
        int64_t seqnumMF = conMF.SequenceNumber();
        if(seqnumMF < 0) DebugStop();
        for (int idf=0; idf<blsize; idf++) {
            auto getval = sol(block.Index(seqnum, idf));
            solMF(blockMF.Index(seqnumMF, idf)) = getval;
        }
	}
    
    
    // copy the solution of the submesh to father mesh
    if(1)
    {
        TPZSubCompMesh *msub = dynamic_cast<TPZSubCompMesh*>(MFMesh);
        if(msub){
            TPZCompMesh * fathermesh = msub->FatherMesh();
            //TODOCOMPLEX
            TPZFMatrix<TVar> &fathermeshSol = fathermesh->Solution();
            TPZCompEl *compel = dynamic_cast<TPZCompEl*>(msub);
            int nconnect = compel->NConnects();
            
            for(int ic=0; ic<nconnect ; ic++){
                
                int64_t fatherconIndex = compel->ConnectIndex(ic);
                int64_t submeshIndex = msub->InternalIndex(fatherconIndex);
                if(fatherconIndex == -1) DebugStop();
                //acessing the block on father mesh
                TPZBlock &blockfather = fathermesh->Block();
                TPZFMatrix<TVar> &solfather = fathermesh->Solution();
                
                TPZConnect &confather = fathermesh->ConnectVec()[fatherconIndex];
                int64_t seqnumfather = confather.SequenceNumber();
                int nblock = blockfather.Size(seqnumfather);
                //acessing the block on submesh
                TPZBlock &blocksub = msub->Block();
                TPZFMatrix<TVar> &solsub = ((TPZCompMesh *)(msub))->Solution();
                const TPZConnect &consub = msub->ConnectVec()[submeshIndex];
                const int64_t seqnumsub = consub.SequenceNumber();
                
                if(seqnumfather < 0) DebugStop();
                for(int idf=0 ; idf<nblock; idf++){
                    const int posfather = blockfather.Position(seqnumfather);
                    auto valsub = solsub(blocksub.Index(seqnumsub, idf));
                    fathermeshSol(posfather + idf) = valsub;
                }
            }
            
        }
    }
    
    int64_t nel = MFMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = MFMesh->Element(el);
        TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
        if(sub)
        {
            TransferFromMeshes(cmeshVec, sub);
        }
    }
}